

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O1

void __thiscall CorUnix::CPalThread::ReleaseThreadReference(CPalThread *this)

{
  LONG *pLVar1;
  int iVar2;
  uint uVar3;
  
  LOCK();
  pLVar1 = &this->m_lRefCount;
  iVar2 = *pLVar1;
  *pLVar1 = *pLVar1 + -1;
  UNLOCK();
  uVar3 = iVar2 - 1;
  if ((int)uVar3 < 0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseThreadReference",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x81d);
    fprintf(_stderr,
            "Expression: lRefCount >= 0, Description: Released a thread and ended with a negative refcount (%ld)\n"
            ,(ulong)uVar3);
  }
  if (uVar3 != 0) {
    return;
  }
  (**this->_vptr_CPalThread)(this);
  memset(this,0xcc,0x708);
  CCLock::Enter(&free_threads_spinlock);
  this->m_pNext = free_threads_list.m_val;
  free_threads_list.m_val = this;
  CCLock::Leave(&free_threads_spinlock);
  return;
}

Assistant:

void
CPalThread::ReleaseThreadReference(
    void
    )
{
    LONG lRefCount = InterlockedDecrement(&m_lRefCount);
    _ASSERT_MSG(lRefCount >= 0, "Released a thread and ended with a negative refcount (%ld)\n", lRefCount);
    if (0 == lRefCount)
    {
        FreeTHREAD(this);
    }

}